

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void randomBlob(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int n_00;
  _func_void_void_ptr *xDel;
  void *in_RDX;
  undefined4 in_ESI;
  uchar *p;
  int n;
  void *in_stack_000000f8;
  int in_stack_00000104;
  undefined4 in_stack_fffffffffffffff0;
  
  n_00 = sqlite3_value_int((sqlite3_value *)0x1dc4af);
  if (n_00 < 1) {
    n_00 = 1;
  }
  xDel = (_func_void_void_ptr *)
         contextMalloc((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(i64)in_RDX);
  if (xDel != (_func_void_void_ptr *)0x0) {
    sqlite3_randomness(in_stack_00000104,in_stack_000000f8);
    sqlite3_result_blob((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,n_00,
                        xDel);
  }
  return;
}

Assistant:

static void randomBlob(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int n;
  unsigned char *p;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int(argv[0]);
  if( n<1 ){
    n = 1;
  }
  p = contextMalloc(context, n);
  if( p ){
    sqlite3_randomness(n, p);
    sqlite3_result_blob(context, (char*)p, n, sqlite3_free);
  }
}